

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::FloorLog2(uint x)

{
  int y;
  uint x_local;
  
  y = 0;
  for (x_local = x; 1 < x_local; x_local = x_local >> 1) {
    y = y + 1;
  }
  return y;
}

Assistant:

static int FloorLog2(unsigned x) {
  //
  // For x > 0, floorLog2(y) returns floor(log(x)/log(2)).
  //
  int y = 0;
  while (x > 1) {
    y += 1;
    x >>= 1u;
  }
  return y;
}